

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_hc.cpp
# Opt level: O3

void __thiscall
crnlib::dxt_hc::determine_alpha_endpoint_clusters_task(dxt_hc *this,uint64 data,void *pData_ptr)

{
  undefined8 uVar1;
  undefined8 uVar2;
  tile_details *ptVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  ulong uVar6;
  uint a;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  uint16 uVar10;
  ulong uVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  
  uVar8 = CONCAT44(0,this->m_pTask_pool->m_num_threads + 1);
  uVar6 = (ulong)(this->m_tiles).m_size;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar8;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar6 * data;
  uVar8 = ((data + 1) * uVar6) / uVar8;
  if (SUB164(auVar5 / auVar4,0) < (uint)uVar8) {
    uVar6 = SUB168(auVar5 / auVar4,0) & 0xffffffff;
    uVar9 = (ulong)this->m_num_alpha_blocks;
    do {
      if (((this->m_tiles).m_p[uVar6].pixels.m_size != 0) && ((int)uVar9 != 0)) {
        uVar7 = 0;
        do {
          ptVar3 = (this->m_tiles).m_p;
          uVar9 = 0;
          uVar10 = 0;
          if ((ulong)*(uint *)((long)pData_ptr + 0xa0) != 0) {
            uVar1 = *(undefined8 *)ptVar3[uVar6].alpha_endpoints[uVar7].m_s;
            uVar11 = 0;
            fVar12 = 1e+37;
            do {
              uVar2 = *(undefined8 *)(*(long *)((long)pData_ptr + 0x98) + uVar11 * 8);
              fVar13 = (float)uVar2 - (float)uVar1;
              fVar14 = (float)((ulong)uVar2 >> 0x20) - (float)((ulong)uVar1 >> 0x20);
              fVar13 = fVar14 * fVar14 + fVar13 * fVar13;
              if (fVar13 < fVar12) {
                if ((fVar13 == 0.0) && (!NAN(fVar13))) {
                  uVar10 = (uint16)uVar11;
                  break;
                }
                uVar9 = uVar11 & 0xffffffff;
                fVar12 = fVar13;
              }
              uVar10 = (uint16)uVar9;
              uVar11 = uVar11 + 1;
            } while (*(uint *)((long)pData_ptr + 0xa0) != uVar11);
          }
          ptVar3[uVar6].cluster_indices[uVar7 + 1] = uVar10;
          uVar7 = uVar7 + 1;
          uVar9 = (ulong)this->m_num_alpha_blocks;
        } while (uVar7 < uVar9);
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < (uVar8 & 0xffffffff));
  }
  return;
}

Assistant:

void dxt_hc::determine_alpha_endpoint_clusters_task(uint64 data, void* pData_ptr) {
  tree_clusterizer<vec2F>* vq = (tree_clusterizer<vec2F>*)pData_ptr;
  const crnlib::vector<vec2F>& codebook = vq->get_codebook();
  uint num_tasks = m_pTask_pool->get_num_threads() + 1;
  for (uint t = m_tiles.size() * data / num_tasks, tEnd = m_tiles.size() * (data + 1) / num_tasks; t < tEnd; t++) {
    if (m_tiles[t].pixels.size()) {
      for (uint a = 0; a < m_num_alpha_blocks; a++) {
        const vec2F& v = m_tiles[t].alpha_endpoints[a];
        float best_dist = math::cNearlyInfinite;
        uint best_index = 0;
        for (uint i = 0; i < codebook.size(); i++) {
          float dist = (codebook[i][0] - v[0]) * (codebook[i][0] - v[0]) + (codebook[i][1] - v[1]) * (codebook[i][1] - v[1]);
          if (dist < best_dist) {
            best_dist = dist;
            best_index = i;
            if (best_dist == 0.0f)
              break;
          }
        }
        m_tiles[t].cluster_indices[cAlpha0 + a] = best_index;
      }
    }
  }
}